

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::SchemaFile>
          (FlatBufferBuilderImpl<false> *this,Offset<reflection::SchemaFile> *v,size_t len)

{
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_> OVar1;
  _TmpBuf __buf;
  _Iter_comp_iter<flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<reflection::SchemaFile>_>
  local_48;
  _Temporary_buffer<flatbuffers::Offset<reflection::SchemaFile>_*,_flatbuffers::Offset<reflection::SchemaFile>_>
  local_40;
  
  if (len != 0) {
    std::
    _Temporary_buffer<flatbuffers::Offset<reflection::SchemaFile>_*,_flatbuffers::Offset<reflection::SchemaFile>_>
    ::_Temporary_buffer(&local_40,v,(long)((len - ((long)(len + 1) >> 0x3f)) + 1) >> 1);
    local_48._M_comp.buf_ =
         (TableKeyComparator<reflection::SchemaFile>)
         (TableKeyComparator<reflection::SchemaFile>)this;
    if (local_40._M_buffer == (Offset<reflection::SchemaFile> *)0x0) {
      std::
      __inplace_stable_sort<flatbuffers::Offset<reflection::SchemaFile>*,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<reflection::SchemaFile>>>
                (v,v + len,&local_48);
    }
    else {
      std::
      __stable_sort_adaptive<flatbuffers::Offset<reflection::SchemaFile>*,flatbuffers::Offset<reflection::SchemaFile>*,long,__gnu_cxx::__ops::_Iter_comp_iter<flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<reflection::SchemaFile>>>
                (v,v + len,local_40._M_buffer,local_40._M_len,&local_48);
    }
    operator_delete(local_40._M_buffer,local_40._M_len << 2);
  }
  OVar1 = CreateVector<reflection::SchemaFile>(this,v,len);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_>)
         OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVectorOfSortedTables(Offset<T> *v,
                                                       size_t len) {
    std::stable_sort(v, v + len, TableKeyComparator<T>(buf_));
    return CreateVector(v, len);
  }